

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O2

void anon_unknown.dwarf_2badaf::check<bool>(istream *is,bool c)

{
  ostream *poVar1;
  char c_1;
  
  std::istream::read((char *)is,(long)&c_1);
  poVar1 = std::operator<<((ostream *)&std::cout,_screenWindowCenter + (*_screenWindowCenter == '*')
                          );
  poVar1 = std::operator<<(poVar1,": expected ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,", got ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  if ((c_1 != '\0') == c) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,99,"void (anonymous namespace)::check(istream &, T) [T = bool]");
}

Assistant:

void
check (istream& is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid (v).name () << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}